

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.hpp
# Opt level: O0

void __thiscall helics::apps::SineGenerator::SineGenerator(SineGenerator *this,string_view name)

{
  string_view name_00;
  size_t in_RDX;
  SignalGenerator *in_RSI;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  
  name_00._M_str = unaff_retaddr;
  name_00._M_len = in_RDX;
  SignalGenerator::SignalGenerator(in_RSI,name_00);
  *in_RDI = &PTR__SineGenerator_009bf1a0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0x416312d000000000;
  in_RDI[0xe] = 0;
  return;
}

Assistant:

explicit SineGenerator(std::string_view name): SignalGenerator(name) {}